

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool __thiscall BasePort::CheckFwBusGeneration(BasePort *this,string *caller,bool doScan)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  bool local_1a;
  bool ret;
  bool doScan_local;
  string *caller_local;
  BasePort *this_local;
  
  local_1a = this->FwBusGeneration == this->newFwBusGeneration;
  if (!local_1a) {
    poVar2 = std::operator<<(this->outStr,(string *)caller);
    poVar2 = std::operator<<(poVar2,": Firewire bus reset, old generation = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->FwBusGeneration);
    poVar2 = std::operator<<(poVar2,", new generation = ");
    this_00 = (void *)std::ostream::operator<<(poVar2,this->newFwBusGeneration);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    if (doScan) {
      iVar1 = (*this->_vptr_BasePort[0x1c])(this,caller);
      local_1a = (bool)((byte)iVar1 & 1);
    }
  }
  return local_1a;
}

Assistant:

bool BasePort::CheckFwBusGeneration(const std::string &caller, bool doScan)
{
    bool ret = (FwBusGeneration == newFwBusGeneration);
    if (!ret) {
        outStr << caller << ": Firewire bus reset, old generation = " << FwBusGeneration
               << ", new generation = " << newFwBusGeneration << std::endl;
        if (doScan)
            ret = ReScanNodes(caller);
    }
    return ret;
}